

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbd.h
# Opt level: O2

void embree::collide2::updatePositions(ClothModel *model,float h)

{
  pointer pVVar1;
  pointer pVVar2;
  char cVar3;
  task *ptVar4;
  runtime_error *this;
  auto_partitioner local_d9;
  small_object_pool *local_d8;
  float h_local;
  ClothModel *local_c8;
  float *local_c0;
  undefined8 local_b8;
  undefined4 local_b0;
  wait_context local_a8;
  task_group_context context;
  
  local_c0 = &h_local;
  pVVar1 = (model->super_Mesh).x_.
           super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pVVar2 = (model->super_Mesh).x_.
           super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>._M_impl.
           super__Vector_impl_data._M_start;
  h_local = h;
  local_c8 = model;
  tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX);
  if (pVVar1 != pVVar2) {
    local_d8 = (small_object_pool *)0x0;
    ptVar4 = (task *)tbb::detail::r1::allocate(&local_d8,0x80);
    ptVar4->m_reserved[3] = 0;
    ptVar4->m_reserved[4] = 0;
    ptVar4->m_reserved[1] = 0;
    ptVar4->m_reserved[2] = 0;
    ptVar4->m_reserved[5] = 0;
    (ptVar4->super_task_traits).m_version_and_traits = 0;
    ptVar4->m_reserved[0] = 0;
    ptVar4->_vptr_task = (_func_int **)&PTR__task_002aac90;
    ptVar4[1]._vptr_task = (_func_int **)((long)pVVar1 - (long)pVVar2 >> 4);
    ptVar4[1].super_task_traits.m_version_and_traits = 0;
    ptVar4[1].m_reserved[0] = 1;
    ptVar4[1].m_reserved[1] = (uint64_t)&local_c8;
    tbb::detail::d1::auto_partition_type::auto_partition_type
              ((auto_partition_type *)(ptVar4[1].m_reserved + 3),&local_d9);
    ptVar4[1].m_reserved[5] = (uint64_t)local_d8;
    local_b8 = 0;
    local_b0 = 1;
    local_a8.m_version_and_traits = 1;
    local_a8.m_ref_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1;
    ptVar4[1].m_reserved[2] = (uint64_t)&local_b8;
    tbb::detail::r1::execute_and_wait(ptVar4,&context,&local_a8,&context);
  }
  cVar3 = tbb::detail::r1::is_group_execution_cancelled(&context);
  if (cVar3 == '\0') {
    tbb::detail::d1::task_group_context::~task_group_context(&context);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"task cancelled");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void updatePositions (ClothModel & model, float h) {

    parallel_for ((size_t)0, model.x_.size (), [&] (const range<size_t>& r) {
        for (size_t i=r.begin(); i<r.end(); i++) {

            model.x_last_[i].x = model.x_old_[i].x;
            model.x_last_[i].y = model.x_old_[i].y;
            model.x_last_[i].z = model.x_old_[i].z;

            model.x_old_[i].x = model.x_[i].x;
            model.x_old_[i].y = model.x_[i].y;
            model.x_old_[i].z = model.x_[i].z;

            model.v_[i].x += model.a_[i].x * h;
            model.v_[i].y += model.a_[i].y * h;
            model.v_[i].z += model.a_[i].z * h;

            model.x_[i].x += model.v_[i].x * h;
            model.x_[i].y += model.v_[i].y * h;
            model.x_[i].z += model.v_[i].z * h;
        }
    });
}